

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowImpl.cpp
# Opt level: O0

void __thiscall FlowImpl::FlowImpl(FlowImpl *this,FlowImpl *f)

{
  FlowImpl *f_local;
  FlowImpl *this_local;
  
  Flow::Flow(&this->super_Flow);
  (this->super_Flow)._vptr_Flow = (_func_int **)&PTR___cxa_pure_virtual_00111b20;
  std::__cxx11::string::string((string *)&this->name);
  (*(f->super_Flow)._vptr_Flow[1])(f,this->target);
  return;
}

Assistant:

FlowImpl::FlowImpl(FlowImpl *f) {
    f->setTarget(target);

}